

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O1

void __thiscall
llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[14],llvm::cl::desc>
          (opt<bool,false,llvm::cl::parser<bool>> *this,char (*Ms) [14],desc *Ms_1)

{
  size_t sVar1;
  size_t sVar2;
  StringRef S;
  
  *(undefined4 *)(this + 8) = 0;
  *(ushort *)(this + 0xc) = *(ushort *)(this + 0xc) & 0xf000;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 **)(this + 0x48) = &GeneralCategory;
  *(opt<bool,false,llvm::cl::parser<bool>> **)(this + 0x50) = this + 0x70;
  *(opt<bool,false,llvm::cl::parser<bool>> **)(this + 0x58) = this + 0x70;
  *(undefined8 *)(this + 0x60) = 4;
  *(undefined4 *)(this + 0x68) = 0;
  this[0x90] = (opt<bool,false,llvm::cl::parser<bool>>)0x0;
  this[0x98] = (opt<bool,false,llvm::cl::parser<bool>>)0x0;
  *(undefined ***)(this + 0xa0) = &PTR_compare_00189328;
  *(undefined2 *)(this + 0xa8) = 0x100;
  *(undefined ***)this = &PTR_handleOccurrence_00189ad0;
  *(undefined ***)(this + 0xb0) = &PTR_getValueName_001895c0;
  sVar2 = strlen(*Ms);
  S.Length = sVar2;
  S.Data = *Ms;
  Option::setArgStr((Option *)this,S);
  sVar1 = (Ms_1->Desc).Length;
  *(char **)(this + 0x28) = (Ms_1->Desc).Data;
  *(size_t *)(this + 0x30) = sVar1;
  Option::addArgument((Option *)this);
  return;
}

Assistant:

explicit opt(const Mods &... Ms)
      : Option(Optional, NotHidden), Parser(*this) {
    apply(this, Ms...);
    done();
  }